

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrespondent.c
# Opt level: O3

int nn_xrespondent_create(void *hint,nn_sockbase **sockbase)

{
  nn_xrespondent *self;
  
  self = (nn_xrespondent *)nn_alloc_(0x1b0);
  if (self != (nn_xrespondent *)0x0) {
    nn_xrespondent_init(self,&nn_xrespondent_sockbase_vfptr,hint);
    *sockbase = (nn_sockbase *)self;
    return 0;
  }
  nn_xrespondent_create_cold_1();
}

Assistant:

static int nn_xrespondent_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xrespondent *self;

    self = nn_alloc (sizeof (struct nn_xrespondent), "socket (xrespondent)");
    alloc_assert (self);
    nn_xrespondent_init (self, &nn_xrespondent_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}